

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::
     ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
               (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                *input,Property *output,string *err)

{
  bool bVar1;
  Variability *pVVar2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  value_type *v;
  AttrMeta *pAVar3;
  AttrMeta *this;
  Property local_9b8;
  int local_3d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [32];
  fmt local_388 [32];
  undefined1 local_368 [8];
  PrimVar pvar;
  Value val;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> pv;
  undefined1 local_2d0 [8];
  Attribute attr;
  string *err_local;
  Property *output_local;
  TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *input_local;
  
  attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  Attribute::Attribute((Attribute *)local_2d0);
  pVVar2 = Attribute::variability((Attribute *)local_2d0);
  *pVVar2 = Uniform;
  tinyusdz::value::TypeTraits<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
  type_name_abi_cxx11_();
  Attribute::set_type_name((Attribute *)local_2d0,(string *)((long)&pv.contained + 0x10));
  ::std::__cxx11::string::~string((string *)((long)&pv.contained + 0x10));
  bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
          is_blocked(input);
  if (bVar1) {
    bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
            is_blocked(input);
    Attribute::set_blocked((Attribute *)local_2d0,bVar1);
  }
  bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
          has_connections(input);
  if (bVar1) {
    paths = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
            get_connections(input);
    Attribute::set_connections((Attribute *)local_2d0,paths);
  }
  bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::has_value
                    (input);
  if (bVar1) {
    TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::get_value
              ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
               &val.v_.vtable,input);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&val.v_.vtable);
    if (bVar1) {
      v = nonstd::optional_lite::
          optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::value
                    ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                     &val.v_.vtable);
      tinyusdz::value::Value::Value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                ((Value *)&pvar._ts._dirty,v);
      primvar::PrimVar::PrimVar((PrimVar *)local_368);
      primvar::PrimVar::set_value<tinyusdz::value::Value>
                ((PrimVar *)local_368,(Value *)&pvar._ts._dirty);
      Attribute::set_var((Attribute *)local_2d0,(PrimVar *)local_368);
      primvar::PrimVar::~PrimVar((PrimVar *)local_368);
      tinyusdz::value::Value::~Value((Value *)&pvar._ts._dirty);
      local_3d4 = 0;
    }
    else {
      if (attr._metas.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3a8,"[InternalError] Invalid TypedAttribute<{}> value.",&local_3a9);
        tinyusdz::value::TypeTraits<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
        type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_388,(string *)local_3a8,local_3d0);
        ::std::__cxx11::string::operator+=
                  ((string *)
                   attr._metas.stringData.
                   super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_388);
        ::std::__cxx11::string::~string((string *)local_388);
        ::std::__cxx11::string::~string((string *)local_3d0);
        ::std::__cxx11::string::~string(local_3a8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      }
      input_local._7_1_ = 0;
      local_3d4 = 1;
    }
    nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
    ::~optional((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                &val.v_.vtable);
    if (local_3d4 != 0) goto LAB_007e95e4;
  }
  pAVar3 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::metas
                     (input);
  this = Attribute::metas((Attribute *)local_2d0);
  AttrMetas::operator=(this,pAVar3);
  Property::Property(&local_9b8,(Attribute *)local_2d0,false);
  Property::operator=(output,&local_9b8);
  Property::~Property(&local_9b8);
  input_local._7_1_ = 1;
  local_3d4 = 1;
LAB_007e95e4:
  Attribute::~Attribute((Attribute *)local_2d0);
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

bool ToProperty(const TypedAttribute<T> &input, Property &output, std::string *err) {

#if 0 // old-code: TODO: Remove
  if (input.is_blocked()) {
    Attribute attr;
    attr.set_blocked(input.is_blocked());
    attr.variability() = Variability::Uniform;
    attr.set_type_name(value::TypeTraits<T>::type_name());
    output = Property(std::move(attr), /*custom*/ false);
  } else if (input.is_value_empty()) {
    // type info only
    output = Property::MakeEmptyAttrib(value::TypeTraits<T>::type_name(),
                                       /* custom */ false);
  } else if (input.is_connection()) {
    // Use Relation for Connection(as typed relationshipTarget)
    // Single connection targetPath only.
    Relationship relTarget;
    std::vector<Path> paths = input.get_connections();
    if (paths.empty()) {
      if (err) {
        (*err) += fmt::format(
            "[InternalError] Connection attribute but empty targetPaths.");
      }
      return false;
    } else if (paths.size() == 1) {
      output = Property(paths[0], /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else {
      output = Property(paths, /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    }

  } else {
    // Includes !authored()
    if (auto pv = input.get_value()) {
      value::Value val(pv.value());
      primvar::PrimVar pvar;
      pvar.set_value(val);
      Attribute attr;
      attr.set_var(std::move(pvar));
      attr.variability() = Variability::Uniform;
      output = Property(attr, /* custom */ false);
    } else {
      if (err) {
        (*err) +=
            fmt::format("[InternalError] Invalid TypedAttribute<{}> value.",
                        value::TypeTraits<T>::type_name());
      }

      return false;
    }
  }
#else

  Attribute attr;
  attr.variability() = Variability::Uniform;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    attr.set_connections(input.get_connections());
  }

  if (input.has_value()) {
    // Includes !authored()
    if (auto pv = input.get_value()) {
      value::Value val(pv.value());
      primvar::PrimVar pvar;
      pvar.set_value(val);

      attr.set_var(std::move(pvar));
    } else {
      if (err) {
        (*err) += fmt::format("[InternalError] Invalid TypedAttribute<{}> value.", value::TypeTraits<T>::type_name());
      }

      return false;
    }
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /* custom */false);

#endif

  return true;
}